

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate2<std::complex<float>_>::apply
          (QGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  complex<float> *pcVar4;
  byte bVar5;
  uint __line;
  int iVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  char *__assertion;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  float extraout_XMM0_Da_09;
  float extraout_XMM0_Da_10;
  float extraout_XMM0_Da_11;
  float extraout_XMM0_Da_12;
  float extraout_XMM0_Da_13;
  float extraout_XMM0_Da_14;
  float extraout_XMM0_Da_15;
  float extraout_XMM0_Da_16;
  float extraout_XMM0_Da_17;
  float extraout_XMM0_Da_18;
  float extraout_XMM0_Da_19;
  float extraout_XMM0_Da_20;
  float extraout_XMM0_Da_21;
  float extraout_XMM0_Da_22;
  float extraout_XMM0_Da_23;
  float extraout_XMM0_Da_24;
  float extraout_XMM0_Da_25;
  float extraout_XMM0_Da_26;
  float extraout_XMM0_Da_27;
  float extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  float extraout_XMM0_Da_30;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  float extraout_XMM0_Db_07;
  float extraout_XMM0_Db_08;
  float extraout_XMM0_Db_09;
  float extraout_XMM0_Db_10;
  float extraout_XMM0_Db_11;
  float extraout_XMM0_Db_12;
  float extraout_XMM0_Db_13;
  float extraout_XMM0_Db_14;
  float extraout_XMM0_Db_15;
  float extraout_XMM0_Db_16;
  float extraout_XMM0_Db_17;
  float extraout_XMM0_Db_18;
  float extraout_XMM0_Db_19;
  float extraout_XMM0_Db_20;
  float extraout_XMM0_Db_21;
  float extraout_XMM0_Db_22;
  float extraout_XMM0_Db_23;
  float extraout_XMM0_Db_24;
  float extraout_XMM0_Db_25;
  float extraout_XMM0_Db_26;
  float extraout_XMM0_Db_27;
  float extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  float extraout_XMM0_Db_30;
  SquareMatrix<std::complex<float>_> mat2;
  complex<float> x4;
  complex<float> x3;
  complex<float> x2;
  long local_c8;
  complex<float> x1;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_b0;
  undefined8 local_a8;
  long local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  SquareMatrix<std::complex<float>_> local_58;
  vector<int,_std::allocator<int>_> qubits;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    __line = 0x23;
  }
  else {
    bVar8 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar8 & 0x1f))) {
      (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[5])(&qubits,this);
      iVar6 = *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + offset;
      *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = iVar6;
      iVar12 = offset + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[1];
      qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = iVar12;
      if (iVar6 < nbQubits) {
        if (iVar12 < nbQubits) {
          if (iVar6 + 1 == iVar12) {
            (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&mat2,this);
            dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&mat2);
            if (side == Left) {
              if (nbQubits == 2) {
                dense::SquareMatrix<std::complex<float>_>::operator*=(matrix,&mat2);
              }
              else {
                bVar5 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start & 0x1f;
                bVar8 = ~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[1] + bVar8 & 0x1f;
                local_68 = (ulong)(1 << bVar8);
                local_98 = local_68 * 4;
                uVar10 = (ulong)(uint)(0 << bVar8);
                local_90 = 0;
                if (0 < (long)local_68) {
                  local_90 = local_68;
                }
                local_88 = (ulong)(uint)(1 << bVar5);
                if (1 << bVar5 < 1) {
                  local_88 = uVar10;
                }
                local_70 = local_68 * 2;
                local_78 = local_68 * 3;
                for (; (long)uVar10 < matrix->size_; uVar10 = uVar10 + 1) {
                  lVar14 = 0;
                  local_60 = 0;
                  while( true ) {
                    uVar11 = local_90;
                    local_80 = lVar14;
                    if (local_60 == local_88) break;
                    while (uVar11 != 0) {
                      lVar7 = local_68 + lVar14;
                      lVar1 = local_70 + lVar14;
                      lVar2 = local_78 + lVar14;
                      lVar3 = matrix->size_;
                      pcVar4 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      x1._M_value = pcVar4[lVar3 * lVar14 + uVar10]._M_value;
                      x2._M_value = pcVar4[lVar3 * lVar7 + uVar10]._M_value;
                      x3._M_value = pcVar4[lVar3 * lVar1 + uVar10]._M_value;
                      x4._M_value = pcVar4[lVar3 * lVar2 + uVar10]._M_value;
                      local_a8 = uVar11 - 1;
                      std::operator*((complex<float> *)
                                     mat2.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl,&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 8),&x2);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 0x10),&x3);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 0x18),&x4);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [matrix->size_ * lVar14 + uVar10]._M_value =
                           CONCAT44(extraout_XMM0_Db + extraout_XMM0_Db_00 + extraout_XMM0_Db_01 +
                                    extraout_XMM0_Db_02,
                                    extraout_XMM0_Da + extraout_XMM0_Da_00 + extraout_XMM0_Da_01 +
                                    extraout_XMM0_Da_02);
                      std::operator*((complex<float> *)
                                     (mat2.size_ * 8 +
                                     (long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl),&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 8 + 8),&x2);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 8 + 0x10),&x3);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 8 + 0x18),&x4);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar7 * matrix->size_ + uVar10]._M_value =
                           CONCAT44(extraout_XMM0_Db_03 + extraout_XMM0_Db_04 + extraout_XMM0_Db_05
                                    + extraout_XMM0_Db_06,
                                    extraout_XMM0_Da_03 + extraout_XMM0_Da_04 + extraout_XMM0_Da_05
                                    + extraout_XMM0_Da_06);
                      std::operator*((complex<float> *)
                                     (mat2.size_ * 0x10 +
                                     (long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl),&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x10 + 8),&x2);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x10 + 0x10),&x3);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x10 + 0x18),&x4);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar1 * matrix->size_ + uVar10]._M_value =
                           CONCAT44(extraout_XMM0_Db_07 + extraout_XMM0_Db_08 + extraout_XMM0_Db_09
                                    + extraout_XMM0_Db_10,
                                    extraout_XMM0_Da_07 + extraout_XMM0_Da_08 + extraout_XMM0_Da_09
                                    + extraout_XMM0_Da_10);
                      std::operator*((complex<float> *)
                                     (mat2.size_ * 0x18 +
                                     (long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl),&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x18 + 8),&x2);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x18 + 0x10),&x3);
                      std::operator*((complex<float> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x18 + 0x18),&x4);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar2 * matrix->size_ + uVar10]._M_value =
                           CONCAT44(extraout_XMM0_Db_11 + extraout_XMM0_Db_12 + extraout_XMM0_Db_13
                                    + extraout_XMM0_Db_14,
                                    extraout_XMM0_Da_11 + extraout_XMM0_Da_12 + extraout_XMM0_Da_13
                                    + extraout_XMM0_Da_14);
                      lVar14 = lVar14 + 1;
                      uVar11 = local_a8;
                    }
                    local_60 = local_60 + 1;
                    lVar14 = local_80 + local_98;
                  }
                }
              }
            }
            else if (nbQubits == 2) {
              dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_58,&mat2);
              dense::operator*((dense *)&x1,&local_58,matrix);
              dense::SquareMatrix<std::complex<float>_>::operator=
                        (matrix,(SquareMatrix<std::complex<float>_> *)&x1);
              std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
              ~unique_ptr(&local_b0);
              std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
              ~unique_ptr(&local_58.data_);
            }
            else {
              bVar5 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start & 0x1f;
              bVar8 = ~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[1] + bVar8 & 0x1f;
              lVar7 = (long)(1 << bVar8);
              uVar10 = (ulong)(uint)(0 << bVar8);
              lVar14 = 0;
              if (0 < lVar7) {
                lVar14 = lVar7;
              }
              local_70 = (ulong)(uint)(1 << bVar5);
              if (1 << bVar5 < 1) {
                local_70 = uVar10;
              }
              local_60 = lVar14 << 3;
              local_78 = lVar7 << 5;
              local_90 = lVar7 * 8;
              local_98 = lVar7 * 0x18;
              local_88 = lVar7 << 4;
              lVar14 = 0;
              while (lVar14 < matrix->size_) {
                local_c8 = 0;
                uVar9 = 0;
                uVar11 = local_90;
                lVar7 = local_98;
                uVar15 = local_88;
                local_80 = lVar14;
                while (uVar9 != local_70) {
                  local_68 = uVar9;
                  for (uVar13 = 0; local_60 != uVar13; uVar13 = uVar13 + 8) {
                    lVar14 = matrix->size_ * uVar10;
                    pcVar4 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                    x1._M_value = *(_ComplexT *)
                                   ((long)&pcVar4->_M_value + uVar13 + local_c8 + lVar14);
                    x2._M_value = *(_ComplexT *)((long)&pcVar4->_M_value + uVar13 + uVar11 + lVar14)
                    ;
                    x3._M_value = *(_ComplexT *)((long)&pcVar4->_M_value + uVar13 + uVar15 + lVar14)
                    ;
                    x4._M_value = *(_ComplexT *)((long)&pcVar4->_M_value + uVar13 + lVar7 + lVar14);
                    std::operator*((complex<float> *)
                                   mat2.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                                   ,&x1);
                    std::operator*((complex<float> *)
                                   (mat2.size_ * 8 +
                                   (long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                         .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                         _M_head_impl),&x2);
                    std::operator*((complex<float> *)
                                   (mat2.size_ * 0x10 +
                                   (long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                         .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                         _M_head_impl),&x3);
                    local_a8._0_4_ = extraout_XMM0_Da_17;
                    local_a8._4_4_ = extraout_XMM0_Db_17;
                    std::operator*((complex<float> *)
                                   (mat2.size_ * 0x18 +
                                   (long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                         .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                         _M_head_impl),&x4);
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              uVar13 + local_c8 + matrix->size_ * uVar10) =
                         CONCAT44(extraout_XMM0_Db_15 + extraout_XMM0_Db_16 + local_a8._4_4_ +
                                  extraout_XMM0_Db_18,
                                  extraout_XMM0_Da_15 + extraout_XMM0_Da_16 + (float)local_a8 +
                                  extraout_XMM0_Da_18);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + 8),&x1);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 8 + 8),&x2);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x10 + 8),&x3);
                    local_a8._0_4_ = extraout_XMM0_Da_21;
                    local_a8._4_4_ = extraout_XMM0_Db_21;
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x18 + 8),&x4);
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              uVar13 + uVar11 + matrix->size_ * uVar10) =
                         CONCAT44(extraout_XMM0_Db_19 + extraout_XMM0_Db_20 + local_a8._4_4_ +
                                  extraout_XMM0_Db_22,
                                  extraout_XMM0_Da_19 + extraout_XMM0_Da_20 + (float)local_a8 +
                                  extraout_XMM0_Da_22);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + 0x10),&x1);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 8 + 0x10),&x2);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x10 + 0x10),&x3);
                    local_a8._0_4_ = extraout_XMM0_Da_25;
                    local_a8._4_4_ = extraout_XMM0_Db_25;
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x18 + 0x10),&x4);
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              uVar13 + uVar15 + matrix->size_ * uVar10) =
                         CONCAT44(extraout_XMM0_Db_23 + extraout_XMM0_Db_24 + local_a8._4_4_ +
                                  extraout_XMM0_Db_26,
                                  extraout_XMM0_Da_23 + extraout_XMM0_Da_24 + (float)local_a8 +
                                  extraout_XMM0_Da_26);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + 0x18),&x1);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 8 + 0x18),&x2);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x10 + 0x18),&x3);
                    local_a8 = CONCAT44(extraout_XMM0_Db_29,extraout_XMM0_Da_29);
                    std::operator*((complex<float> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                          .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x18 + 0x18),&x4);
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              uVar13 + lVar7 + matrix->size_ * uVar10) =
                         CONCAT44(extraout_XMM0_Db_27 + extraout_XMM0_Db_28 + local_a8._4_4_ +
                                  extraout_XMM0_Db_30,
                                  extraout_XMM0_Da_27 + extraout_XMM0_Da_28 + (float)local_a8 +
                                  extraout_XMM0_Da_30);
                  }
                  local_c8 = local_c8 + local_78;
                  uVar11 = uVar11 + local_78;
                  uVar15 = uVar15 + local_78;
                  lVar7 = lVar7 + local_78;
                  uVar9 = local_68 + 1;
                }
                uVar10 = uVar10 + 8;
                lVar14 = local_80 + 1;
              }
            }
            std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
            ~unique_ptr(&mat2.data_);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&qubits.super__Vector_base<int,_std::allocator<int>_>);
            return;
          }
          __assertion = "qubits[0] + 1 == qubits[1]";
          __line = 0x29;
          goto LAB_0038ee88;
        }
        __assertion = "qubits[1] < nbQubits";
      }
      else {
        __assertion = "qubits[0] < nbQubits";
      }
      __line = 0x28;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      __line = 0x24;
    }
  }
LAB_0038ee88:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,__line,
                "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }